

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_custom_name.cpp
# Opt level: O0

int main(void)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  Color *pCVar2;
  ostream *this;
  enable_if_t<Numbers,_string_view> eVar3;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  _Optional_payload_base<Color> local_48;
  enable_if_t<Color,_string_view> local_40;
  enable_if_t<Color,_string_view> local_30;
  enable_if_t<Color,_string_view> local_20;
  undefined4 local_c;
  
  local_c = 0;
  local_20 = magic_enum::enum_name<Color,(magic_enum::detail::enum_subtype)0>(RED);
  pbVar1 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,local_20);
  std::ostream::operator<<((ostream *)pbVar1,std::endl<char,std::char_traits<char>>);
  local_30 = magic_enum::enum_name<Color,(magic_enum::detail::enum_subtype)0>(BLUE);
  pbVar1 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,local_30);
  std::ostream::operator<<((ostream *)pbVar1,std::endl<char,std::char_traits<char>>);
  local_40 = magic_enum::enum_name<Color,(magic_enum::detail::enum_subtype)0>(GREEN);
  pbVar1 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,local_40);
  std::ostream::operator<<((ostream *)pbVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::boolalpha);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_58,"the red color");
  local_48 = (_Optional_payload_base<Color>)
             magic_enum::enum_cast<Color,(magic_enum::detail::enum_subtype)0,std::equal_to<void>>
                       (local_58._M_len,local_58._M_str);
  pCVar2 = std::optional<Color>::value((optional<Color> *)&local_48);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pCVar2 == RED);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  eVar3 = magic_enum::enum_name<Numbers,(magic_enum::detail::enum_subtype)0>(One);
  pbVar1 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,eVar3);
  std::ostream::operator<<((ostream *)pbVar1,std::endl<char,std::char_traits<char>>);
  eVar3 = magic_enum::enum_name<Numbers,(magic_enum::detail::enum_subtype)0>(Two);
  pbVar1 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,eVar3);
  std::ostream::operator<<((ostream *)pbVar1,std::endl<char,std::char_traits<char>>);
  eVar3 = magic_enum::enum_name<Numbers,(magic_enum::detail::enum_subtype)0>(Three);
  pbVar1 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,eVar3);
  std::ostream::operator<<((ostream *)pbVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
  std::cout << magic_enum::enum_name(Color::RED) << std::endl; // 'the red color'
  std::cout << magic_enum::enum_name(Color::BLUE) << std::endl; // 'The BLUE'
  std::cout << magic_enum::enum_name(Color::GREEN) << std::endl; // ''

  std::cout << std::boolalpha;
  std::cout << (magic_enum::enum_cast<Color>("the red color").value() == Color::RED) << std::endl; // true

  std::cout << magic_enum::enum_name(Numbers::One) << std::endl; // 'the one'
  std::cout << magic_enum::enum_name(Numbers::Two) << std::endl; // 'Two'
  std::cout << magic_enum::enum_name(Numbers::Three) << std::endl; // 'Three'

  return 0;
}